

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pageInsertArray(MemPage *pPg,u8 *pBegin,u8 **ppData,u8 *pCellptr,int iFirst,int nCell,
                   CellArray *pCArray)

{
  u8 *puVar1;
  bool bVar2;
  ushort uVar3;
  u8 *__dest;
  long lVar4;
  ulong __n;
  u8 *puVar5;
  int rc;
  int local_34;
  
  puVar5 = *ppData;
  if (0 < nCell) {
    puVar1 = pPg->aData;
    lVar4 = (long)iFirst;
    do {
      uVar3 = pCArray->szCell[lVar4];
      if (uVar3 == 0) {
        uVar3 = computeCellSize(pCArray,(int)lVar4);
      }
      __n = (ulong)uVar3;
      if (((puVar1[1] == '\0') && (puVar1[2] == '\0')) ||
         (__dest = pageFindSlot(pPg,(uint)uVar3,&local_34), __dest == (u8 *)0x0)) {
        if ((long)__n <= (long)puVar5 - (long)pBegin) {
          puVar5 = puVar5 + -__n;
          __dest = puVar5;
          goto LAB_0014e958;
        }
        bVar2 = false;
      }
      else {
LAB_0014e958:
        memmove(__dest,pCArray->apCell[lVar4],__n);
        uVar3 = (short)__dest - (short)puVar1;
        *(ushort *)pCellptr = uVar3 * 0x100 | uVar3 >> 8;
        pCellptr = (u8 *)((long)pCellptr + 2);
        bVar2 = true;
      }
      if (!bVar2) {
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < nCell + iFirst);
  }
  *ppData = puVar5;
  return 0;
}

Assistant:

static int pageInsertArray(
  MemPage *pPg,                   /* Page to add cells to */
  u8 *pBegin,                     /* End of cell-pointer array */
  u8 **ppData,                    /* IN/OUT: Page content -area pointer */
  u8 *pCellptr,                   /* Pointer to cell-pointer area */
  int iFirst,                     /* Index of first cell to add */
  int nCell,                      /* Number of cells to add to pPg */
  CellArray *pCArray              /* Array of cells */
){
  int i;
  u8 *aData = pPg->aData;
  u8 *pData = *ppData;
  int iEnd = iFirst + nCell;
  assert( CORRUPT_DB || pPg->hdrOffset==0 );    /* Never called on page 1 */
  for(i=iFirst; i<iEnd; i++){
    int sz, rc;
    u8 *pSlot;
    sz = cachedCellSize(pCArray, i);
    if( (aData[1]==0 && aData[2]==0) || (pSlot = pageFindSlot(pPg,sz,&rc))==0 ){
      if( (pData - pBegin)<sz ) return 1;
      pData -= sz;
      pSlot = pData;
    }
    /* pSlot and pCArray->apCell[i] will never overlap on a well-formed
    ** database.  But they might for a corrupt database.  Hence use memmove()
    ** since memcpy() sends SIGABORT with overlapping buffers on OpenBSD */
    assert( (pSlot+sz)<=pCArray->apCell[i]
         || pSlot>=(pCArray->apCell[i]+sz)
         || CORRUPT_DB );
    memmove(pSlot, pCArray->apCell[i], sz);
    put2byte(pCellptr, (pSlot - aData));
    pCellptr += 2;
  }
  *ppData = pData;
  return 0;
}